

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_avx512.cpp
# Opt level: O1

int __thiscall ncnn::MatMul_x86_avx512::create_pipeline(MatMul_x86_avx512 *this,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ParamDict PStack_38;
  ModelBinFromMatArray local_28;
  
  pLVar1 = create_layer(0x4a);
  this->gemm = pLVar1;
  ParamDict::ParamDict(&PStack_38);
  ParamDict::set(&PStack_38,2,0);
  ParamDict::set(&PStack_38,3,*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86_avx512[-3]))
  ;
  ParamDict::set(&PStack_38,4,0);
  ParamDict::set(&PStack_38,5,0);
  ParamDict::set(&PStack_38,6,1);
  ParamDict::set(&PStack_38,7,0);
  ParamDict::set(&PStack_38,8,0);
  ParamDict::set(&PStack_38,9,0);
  ParamDict::set(&PStack_38,10,-1);
  ParamDict::set(&PStack_38,0xb,0);
  ParamDict::set(&PStack_38,0xc,1);
  (*this->gemm->_vptr_Layer[2])();
  pLVar1 = this->gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_28,(Mat *)0x0);
  (*pLVar1->_vptr_Layer[3])(pLVar1,&local_28);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_28);
  (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
  ParamDict::~ParamDict(&PStack_38);
  return 0;
}

Assistant:

int MatMul_x86_avx512::create_pipeline(const Option& opt)
{
    gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

    ncnn::ParamDict pd;
    pd.set(2, 0);      // transA
    pd.set(3, transB); // transB
    pd.set(4, 0);      // constantA
    pd.set(5, 0);      // constantB
    pd.set(6, 1);      // constantC
    pd.set(7, 0);      // M = outch
    pd.set(8, 0);      // N = size
    pd.set(9, 0);      // K = maxk*inch
    pd.set(10, -1);    // constant_broadcast_type_C = null
    pd.set(11, 0);     // output_N1M
    pd.set(12, 1);     // output_elempack

    gemm->load_param(pd);

    gemm->load_model(ModelBinFromMatArray(0));

    gemm->create_pipeline(opt);

    return 0;
}